

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O2

void __thiscall tetgenmesh::tspivot(tetgenmesh *this,triface *t,face *s)

{
  uint uVar1;
  double *pdVar2;
  shellface *pppdVar3;
  uint uVar4;
  
  if (t->tet[9] == (tetrahedron)0x0) {
    pppdVar3 = (shellface *)0x0;
  }
  else {
    uVar1 = t->ver;
    pdVar2 = t->tet[9][uVar1 & 3];
    uVar4 = (uint)pdVar2 & 7;
    s->shver = uVar4;
    pppdVar3 = (shellface *)((ulong)pdVar2 & 0xfffffffffffffff8);
    s->shver = tspivottbl[(int)uVar1][uVar4];
  }
  s->sh = pppdVar3;
  return;
}

Assistant:

inline void tetgenmesh::tspivot(triface& t, face& s) 
{
  if ((t).tet[9] == NULL) {
    (s).sh = NULL;
    return;
  }
  // Get the attached subface s.
  sdecode(((shellface *) (t).tet[9])[(t).ver & 3], (s));
  (s).shver = tspivottbl[t.ver][s.shver];
}